

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O0

void reactname(Item *q1,Item *lastok,Item *q2)

{
  Symbol *s_00;
  int iVar1;
  Symbol *pSVar2;
  char *pcVar3;
  Item *in_RDX;
  Item *in_RSI;
  Item *in_RDI;
  Rterm *rnext;
  Symbol *s1;
  Symbol *s;
  char *in_stack_ffffffffffffffc8;
  Rterm *s1_00;
  
  s1_00 = rterm;
  rterm = (Rterm *)emalloc((uint)((ulong)rterm >> 0x20));
  rterm->rnext = s1_00;
  rterm->isstate = 0;
  s_00 = (in_RDI->element).sym;
  if (((s_00->subtype & 0x10U) == 0) || (iVar1 = in_solvefor(s_00), iVar1 == 0)) {
    if ((s_00->subtype & 0x8201eU) == 0) {
      diag((char *)s1_00,in_stack_ffffffffffffffc8);
    }
  }
  else {
    sprintf(buf,"D%s",s_00->name);
    pSVar2 = lookup(in_stack_ffffffffffffffc8);
    pSVar2->usage = pSVar2->usage | 8;
    s_00->used = s_00->used + 1;
    rterm->isstate = 1;
  }
  if (in_RDX == (Item *)0x0) {
    rterm->num = 1;
  }
  else {
    iVar1 = atoi((in_RDX->element).str);
    rterm->num = iVar1;
  }
  if (in_RDI == in_RSI) {
    rterm->str = (char *)0x0;
  }
  else {
    if ((s_00->subtype & 0x20U) == 0) {
      diag((char *)s1_00,in_stack_ffffffffffffffc8);
    }
    pcVar3 = qconcat(in_RSI,in_RDX);
    rterm->str = pcVar3;
  }
  rterm->sym = s_00;
  return;
}

Assistant:

void reactname(q1, lastok, q2) /* NAME [] INTEGER   q2 may be null*/
	Item *q1, *lastok, *q2;
{	/* put on right hand side */
	Symbol *s, *s1;
	Rterm *rnext;

	rnext = rterm;
	rterm = (Rterm *)emalloc(sizeof(Rterm));
	rterm->rnext = rnext;
	rterm->isstate = 0;
	s = SYM(q1);
	if ((s->subtype & STAT) && in_solvefor(s)) {
		Sprintf(buf, "D%s", s->name);
		s1 = lookup(buf);
		s1->usage |= DEP;
		s->used++;
		rterm->isstate = 1;
	} else if (!(s->subtype & (DEP | nmodlCONST | PARM | INDEP | STEP1 | STAT)) ) {
diag(s->name, " must be a STATE, CONSTANT, ASSIGNED, STEPPED, or INDEPENDENT");
	}
	if (q2) {
		rterm->num = atoi(STR(q2));
	}else{
		rterm->num = 1;
	}
	if (q1 != lastok) {
		if(!(s->subtype & ARRAY)) {
			diag("REACTION: MUST be scalar or array", (char *)0);
		}
		rterm->str = qconcat(q1->next->next, lastok->prev);
/* one too many parentheses since normally a *( is prepended to the name
during output in cout.c.  Therefore when used to construct a MATELM or RHS
extra parentheses must be prepended as in MATELM((...,(....
*/ /* this no longer holds, no parentheses are to be prepended */
	} else {
		rterm->str = (char *)0;
	}
	rterm->sym = s;
}